

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O2

bool ImGui::ImageButton(Texture *texture,int framePadding,Color *bgColor,Color *tintColor)

{
  bool bVar1;
  Vector2u VVar2;
  Vector2f local_28;
  
  VVar2 = sf::Texture::getSize(texture);
  local_28.y = (float)((ulong)VVar2 >> 0x20);
  local_28.x = (float)((ulong)VVar2 & 0xffffffff);
  bVar1 = ImageButton(texture,&local_28,framePadding,bgColor,tintColor);
  return bVar1;
}

Assistant:

bool ImageButton(const sf::Texture& texture, const int framePadding, const sf::Color& bgColor,
                 const sf::Color& tintColor) {
    return ImageButton(texture, static_cast<sf::Vector2f>(texture.getSize()), framePadding, bgColor,
                       tintColor);
}